

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

void __thiscall
soul::AST::ModuleBase::performLocalNameSearch
          (ModuleBase *this,NameSearch *search,Statement *param_2)

{
  Scope *pSVar1;
  ASTObject *o;
  char cVar2;
  int iVar3;
  Identifier targetName;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined8 *puVar4;
  undefined4 extraout_var_03;
  long *plVar5;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined8 *extraout_RDX;
  long *extraout_RDX_00;
  pool_ref<soul::AST::Function> *f;
  ArrayView<soul::pool_ref<soul::AST::StructDeclaration>_> local_40;
  undefined4 extraout_var_02;
  undefined4 extraout_var_04;
  
  targetName = IdentifierPath::getLastPart(&search->partiallyQualifiedPath);
  if (search->findVariables == true) {
    iVar3 = (*(this->super_Scope)._vptr_Scope[0xc])(&this->super_Scope);
    local_40.s = (pool_ref<soul::AST::StructDeclaration> *)CONCAT44(extraout_var,iVar3);
    Scope::NameSearch::
    addFirstWithName<soul::ArrayView<soul::pool_ref<soul::AST::VariableDeclaration>>>
              (search,(ArrayView<soul::pool_ref<soul::AST::VariableDeclaration>_> *)&local_40,
               targetName);
  }
  if (search->findTypes == true) {
    iVar3 = (*(this->super_Scope)._vptr_Scope[0xe])(&this->super_Scope);
    local_40.s = (pool_ref<soul::AST::StructDeclaration> *)CONCAT44(extraout_var_00,iVar3);
    Scope::NameSearch::
    addFirstWithName<soul::ArrayView<soul::pool_ref<soul::AST::StructDeclaration>>>
              (search,&local_40,targetName);
    iVar3 = (*(this->super_ASTObject)._vptr_ASTObject[9])(this);
    local_40.s = (pool_ref<soul::AST::StructDeclaration> *)CONCAT44(extraout_var_01,iVar3);
    Scope::NameSearch::
    addFirstWithName<soul::ArrayView<soul::pool_ref<soul::AST::UsingDeclaration>>>
              (search,(ArrayView<soul::pool_ref<soul::AST::UsingDeclaration>_> *)&local_40,
               targetName);
  }
  if (search->findFunctions == true) {
    iVar3 = (*(this->super_Scope)._vptr_Scope[0xd])(&this->super_Scope);
    for (puVar4 = (undefined8 *)CONCAT44(extraout_var_02,iVar3); puVar4 != extraout_RDX;
        puVar4 = puVar4 + 1) {
      o = (ASTObject *)*puVar4;
      if ((o[1].context.location.sourceCode.object == (SourceCodeText *)targetName.name) &&
         (((long)search->requiredNumFunctionArgs < 0 ||
          ((long)o[2].context.location.sourceCode.object - *(long *)&o[2].objectType >> 3 ==
           (long)search->requiredNumFunctionArgs)))) {
        Scope::NameSearch::addResult(search,o);
      }
    }
  }
  if (search->findEndpoints == true) {
    iVar3 = (*(this->super_ASTObject)._vptr_ASTObject[8])(this);
    local_40.s = (pool_ref<soul::AST::StructDeclaration> *)CONCAT44(extraout_var_03,iVar3);
    Scope::NameSearch::
    addFirstWithName<soul::ArrayView<soul::pool_ref<soul::AST::EndpointDeclaration>>>
              (search,(ArrayView<soul::pool_ref<soul::AST::EndpointDeclaration>_> *)&local_40,
               targetName);
  }
  if ((search->findNamespaces != false) || (search->findProcessors == true)) {
    pSVar1 = &this->super_Scope;
    iVar3 = (*(this->super_Scope)._vptr_Scope[0x11])(pSVar1);
    for (plVar5 = (long *)CONCAT44(extraout_var_04,iVar3); plVar5 != extraout_RDX_00;
        plVar5 = plVar5 + 1) {
      if ((string *)((long *)*plVar5)[8] == targetName.name) {
        if (search->findNamespaces == true) {
          cVar2 = (**(code **)(*(long *)*plVar5 + 0x30))();
          if (cVar2 == '\0') goto LAB_0022867f;
        }
        else {
LAB_0022867f:
          if (search->findProcessors != true) goto LAB_002286a4;
          cVar2 = (**(code **)(*(long *)*plVar5 + 0x20))();
          if (cVar2 == '\0') {
            cVar2 = (**(code **)(*(long *)*plVar5 + 0x28))();
            if (cVar2 == '\0') goto LAB_002286a4;
          }
        }
        Scope::NameSearch::addResult(search,(ASTObject *)*plVar5);
        break;
      }
LAB_002286a4:
    }
    if (search->findNamespaces == true) {
      iVar3 = (*(this->super_ASTObject)._vptr_ASTObject[10])(this);
      local_40.s = (pool_ref<soul::AST::StructDeclaration> *)CONCAT44(extraout_var_05,iVar3);
      Scope::NameSearch::
      addFirstWithName<soul::ArrayView<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>>>
                (search,(ArrayView<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>_> *)
                        &local_40,targetName);
    }
    if (search->findProcessors == true) {
      iVar3 = (*pSVar1->_vptr_Scope[0x12])(pSVar1);
      local_40.s = (pool_ref<soul::AST::StructDeclaration> *)CONCAT44(extraout_var_06,iVar3);
      Scope::NameSearch::
      addFirstWithName<soul::ArrayView<soul::pool_ref<soul::AST::ProcessorAliasDeclaration>>>
                (search,(ArrayView<soul::pool_ref<soul::AST::ProcessorAliasDeclaration>_> *)
                        &local_40,targetName);
    }
  }
  return;
}

Assistant:

void performLocalNameSearch (NameSearch& search, const Statement*) const override
        {
            auto targetName = search.partiallyQualifiedPath.getLastPart();

            if (search.findVariables)
                search.addFirstWithName (getVariables(), targetName);

            if (search.findTypes)
            {
                search.addFirstWithName (getStructDeclarations(), targetName);
                search.addFirstWithName (getUsingDeclarations(), targetName);
            }

            if (search.findFunctions)
            {
                for (auto& f : getFunctions())
                {
                    if (f->name == targetName
                         && (search.requiredNumFunctionArgs < 0
                              || f->parameters.size() == static_cast<uint32_t> (search.requiredNumFunctionArgs)))
                    {
                        search.addResult (f);
                    }
                }
            }

            if (search.findEndpoints)
                search.addFirstWithName (getEndpoints(), targetName);

            if (search.findNamespaces || search.findProcessors)
            {
                for (auto& m : getSubModules())
                {
                    if (m->name == targetName)
                    {
                        if ((search.findNamespaces && m->isNamespace())
                             || (search.findProcessors && (m->isProcessor() || m->isGraph())))
                        {
                            search.addResult (m);
                            break;
                        }
                    }
                }

                if (search.findNamespaces)  search.addFirstWithName (getNamespaceAliases(), targetName);
                if (search.findProcessors)  search.addFirstWithName (getProcessorAliases(), targetName);
            }
        }